

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O3

SerializedMessage * __thiscall
miniros::serialization::
serializeServiceResponse<roscpp::SetLoggerLevelResponse_<std::allocator<void>>>
          (SerializedMessage *__return_storage_ptr__,serialization *this,bool ok,
          SetLoggerLevelResponse_<std::allocator<void>_> *message)

{
  uint uVar1;
  element_type *peVar2;
  element_type eVar3;
  uchar *puVar4;
  int iVar5;
  uint8_t *old_data;
  
  eVar3 = (element_type)this;
  (__return_storage_ptr__->message).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->message).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->num_bytes = 0;
  __return_storage_ptr__->message_start = (uint8_t *)0x0;
  (__return_storage_ptr__->buf).super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->buf).super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->type_info = (type_info *)0x0;
  if ((int)this == 0) {
    __return_storage_ptr__->num_bytes = 1;
    puVar4 = (uchar *)operator_new__(1);
    std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::reset<unsigned_char>
              ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__,
               puVar4);
    peVar2 = (__return_storage_ptr__->buf).
             super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((int)__return_storage_ptr__->num_bytes == 0) {
      throwStreamOverrun();
    }
    *peVar2 = eVar3;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->num_bytes = 5;
  puVar4 = (uchar *)operator_new__(5);
  std::__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>::reset<unsigned_char>
            ((__shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__,
             puVar4);
  peVar2 = (__return_storage_ptr__->buf).
           super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar1 = (uint)__return_storage_ptr__->num_bytes;
  if (uVar1 == 0) {
    throwStreamOverrun();
    *peVar2 = eVar3;
    iVar5 = (int)__return_storage_ptr__->num_bytes + -5;
  }
  else {
    *peVar2 = eVar3;
    iVar5 = (int)__return_storage_ptr__->num_bytes + -5;
    if (4 < uVar1) goto LAB_001d92c1;
  }
  throwStreamOverrun();
LAB_001d92c1:
  *(int *)(peVar2 + 1) = iVar5;
  return __return_storage_ptr__;
}

Assistant:

inline SerializedMessage serializeServiceResponse(bool ok, const M& message)
{
  SerializedMessage m;

  if (ok)
  {
    uint32_t len = serializationLength(message);
    m.num_bytes = len + 5;
    m.buf.reset(new uint8_t[m.num_bytes]);

    OStream s(m.buf.get(), static_cast<uint32_t>(m.num_bytes));
    serialize(s, static_cast<uint8_t>(ok));
    serialize(s, static_cast<uint32_t>(m.num_bytes) - 5);
    serialize(s, message);
  }
  else
  {
    uint32_t len = serializationLength(message);
    m.num_bytes = len + 1;
    m.buf.reset(new uint8_t[m.num_bytes]);

    OStream s(m.buf.get(), static_cast<uint32_t>(m.num_bytes));
    serialize(s, static_cast<uint8_t>(ok));
    serialize(s, message);
  }

  return m;
}